

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O0

void __thiscall
DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
EditingIterator::MoveCurrentTo
          (EditingIterator *this,
          DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
          *toList)

{
  NodeBase *node_00;
  DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_> *pDVar1;
  DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_> **ppDVar2;
  NodeBase *node;
  NodeBase *last;
  DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
  *toList_local;
  EditingIterator *this_local;
  
  pDVar1 = DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>::Prev
                     ((this->super_Iterator).current);
  node_00 = (this->super_Iterator).current;
  RemoveNode(node_00);
  ppDVar2 = DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>::Next
                      (&toList->
                        super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                      );
  InsertNodeBefore(*ppDVar2,node_00);
  (this->super_Iterator).current = pDVar1;
  RealCount::DecrementCount(&((this->super_Iterator).list)->super_RealCount);
  RealCount::IncrementCount(&toList->super_RealCount);
  return;
}

Assistant:

void MoveCurrentTo(DListBase * toList)
        {
            NodeBase * last = this->current->Prev();
            NodeBase * node = const_cast<NodeBase *>(this->current);
            DListBase::RemoveNode(node);
            DListBase::InsertNodeBefore(toList->Next(), node);
            this->current = last;
            const_cast<DListBase *>(this->list)->DecrementCount();
            toList->IncrementCount();
        }